

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_hello_decrypt_esni
              (ptls_context_t *ctx,ptls_iovec_t *server_name,ptls_esni_secret_t **secret,
              st_ptls_client_hello_t *ch)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  long in_RCX;
  long *in_RDX;
  ptls_esni_secret_t **in_RSI;
  ptls_iovec_t *in_RDI;
  ptls_iovec_t pVar7;
  uint8_t *in_stack_00000008;
  ptls_cipher_suite_t *in_stack_00000010;
  int in_stack_0000001c;
  ptls_iovec_t found_name;
  uint8_t *end;
  uint8_t *src;
  size_t i;
  int ret;
  ptls_aead_context_t *aead;
  uint8_t *decrypted;
  ptls_key_exchange_context_t **key_share_ctx;
  ptls_esni_context_t **esni;
  uint16_t in_stack_000000be;
  uint8_t *in_stack_000000c0;
  uint8_t *in_stack_000000c8;
  ptls_hash_algorithm_t *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  uint8_t *in_stack_000000f0;
  undefined8 in_stack_ffffffffffffff68;
  int is_server;
  ptls_esni_secret_t **in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  void *in_stack_ffffffffffffff88;
  ptls_aead_context_t *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa0;
  long local_58;
  int local_4c;
  undefined8 *local_40;
  long *local_38;
  long *local_30;
  int local_4;
  
  local_40 = (undefined8 *)0x0;
  if (*in_RDX != 0) {
    __assert_fail("*secret == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0xbff,
                  "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                 );
  }
  pvVar3 = malloc(0xd0);
  *in_RDX = (long)pvVar3;
  if (pvVar3 == (void *)0x0) {
    local_4 = 0x201;
  }
  else {
    memset((void *)*in_RDX,0,0xd0);
    for (local_30 = (long *)in_RDI[3].base;
        is_server = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20), *local_30 != 0;
        local_30 = local_30 + 1) {
      local_58 = 0;
      while ((*(long *)(*(long *)(*local_30 + 8) + local_58 * 0x48) != 0 &&
             (**(short **)(*(long *)(*local_30 + 8) + local_58 * 0x48) !=
              **(short **)(in_RCX + 0xa0)))) {
        local_58 = local_58 + 1;
      }
      if (*(long *)(*(long *)(*local_30 + 8) + local_58 * 0x48) == 0) {
        local_4c = 0x2f;
        goto LAB_00128e31;
      }
      iVar2 = memcmp((void *)(*(long *)(*local_30 + 8) + local_58 * 0x48 + 8),
                     *(void **)(in_RCX + 0xc0),
                     *(size_t *)(*(long *)(*(long *)(in_RCX + 0xa0) + 0x10) + 8));
      is_server = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      if (iVar2 == 0) {
        *(undefined2 *)(*in_RDX + 200) = *(undefined2 *)(*local_30 + 0x28);
        break;
      }
    }
    if (*local_30 == 0) {
      local_4c = 0x2f;
    }
    else {
      for (local_38 = *(long **)*local_30;
          (*local_38 != 0 && (**(short **)*local_38 != **(short **)(in_RCX + 0xa8)));
          local_38 = local_38 + 1) {
      }
      if (*local_38 == 0) {
        local_4c = 0x2f;
      }
      else {
        is_server = (int)((ulong)*(undefined8 *)(in_RCX + 8) >> 0x20);
        local_4c = build_esni_contents_hash
                             (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                              in_stack_000000be,(ptls_iovec_t)in_stack_000000d8,in_stack_000000f0);
        if ((local_4c == 0) &&
           (local_4c = (**(code **)(*local_38 + 0x18))
                                 (local_38,0,*in_RDX,*(undefined8 *)(in_RCX + 0xb0),
                                  *(undefined8 *)(in_RCX + 0xb8)), local_4c == 0)) {
          if (*(long *)(in_RCX + 0xd0) - *(long *)(*(long *)(*(long *)(in_RCX + 0xa0) + 8) + 0x38)
              == (long)(int)(*(ushort *)(*local_30 + 0x10) + 0x10)) {
            local_40 = (undefined8 *)malloc((long)(int)(*(ushort *)(*local_30 + 0x10) + 0x10));
            if (local_40 == (undefined8 *)0x0) {
              local_4c = 0x201;
            }
            else {
              local_4c = create_esni_aead((ptls_aead_context_t **)found_name.base,in_stack_0000001c,
                                          in_stack_00000010,stack0x00000028,in_stack_00000008);
              if (local_4c == 0) {
                pvVar3 = *(void **)(in_RCX + 0x60);
                sVar4 = ptls_aead_decrypt(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                          in_stack_ffffffffffffff78._8_8_,
                                          in_stack_ffffffffffffff78._0_8_,
                                          (uint64_t)in_stack_ffffffffffffff70,pvVar3,
                                          in_stack_ffffffffffffffa0);
                is_server = (int)((ulong)pvVar3 >> 0x20);
                if (sVar4 == (long)(int)(*(ushort *)(*local_30 + 0x10) + 0x10)) {
                  ptls_aead_free((ptls_aead_context_t *)0x128cfb);
                  pcVar5 = (char *)((long)local_40 + (long)(int)(uint)*(ushort *)(*local_30 + 0x10))
                  ;
                  if ((long)pcVar5 - (long)local_40 < 0x10) {
                    local_4c = 0x2f;
                  }
                  else {
                    lVar1 = *in_RDX;
                    *(undefined8 *)(lVar1 + 0x10) = *local_40;
                    *(undefined8 *)(lVar1 + 0x18) = local_40[1];
                    pcVar6 = (char *)(local_40 + 2);
                    local_4c = client_hello_decode_server_name
                                         (in_RDI,(uint8_t **)in_RSI,(uint8_t *)in_RDX);
                    if (local_4c == 0) {
                      for (; pcVar6 != pcVar5; pcVar6 = pcVar6 + 1) {
                        if (*pcVar6 != '\0') {
                          local_4c = 0x2f;
                          goto LAB_00128e31;
                        }
                      }
                      in_stack_ffffffffffffff70 = in_RSI;
                      memmove(local_40,in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff90);
                      pVar7 = ptls_iovec_init(local_40,(size_t)in_stack_ffffffffffffff90);
                      *in_stack_ffffffffffffff70 = (ptls_esni_secret_t *)pVar7.base;
                      in_stack_ffffffffffffff70[1] = (ptls_esni_secret_t *)pVar7.len;
                      local_40 = (undefined8 *)0x0;
                      local_4c = 0;
                    }
                  }
                }
                else {
                  local_4c = 0x33;
                }
              }
            }
          }
          else {
            local_4c = 0x2f;
          }
        }
      }
    }
LAB_00128e31:
    if (local_40 != (undefined8 *)0x0) {
      free(local_40);
    }
    if ((local_4c != 0) && (*in_RDX != 0)) {
      free_esni_secret(in_stack_ffffffffffffff70,is_server);
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

static int client_hello_decrypt_esni(ptls_context_t *ctx, ptls_iovec_t *server_name, ptls_esni_secret_t **secret,
                                     struct st_ptls_client_hello_t *ch)
{
    ptls_esni_context_t **esni;
    ptls_key_exchange_context_t **key_share_ctx;
    uint8_t *decrypted = NULL;
    ptls_aead_context_t *aead = NULL;
    int ret;

    /* allocate secret */
    assert(*secret == NULL);
    if ((*secret = malloc(sizeof(**secret))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    memset(*secret, 0, sizeof(**secret));

    /* find the matching esni structure */
    for (esni = ctx->esni; *esni != NULL; ++esni) {
        size_t i;
        for (i = 0; (*esni)->cipher_suites[i].cipher_suite != NULL; ++i)
            if ((*esni)->cipher_suites[i].cipher_suite->id == ch->esni.cipher->id)
                break;
        if ((*esni)->cipher_suites[i].cipher_suite == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        if (memcmp((*esni)->cipher_suites[i].record_digest, ch->esni.record_digest, ch->esni.cipher->hash->digest_size) == 0) {
            (*secret)->version = (*esni)->version;
            break;
        }
    }
    if (*esni == NULL) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    /* find the matching private key for ESNI decryption */
    for (key_share_ctx = (*esni)->key_exchanges; *key_share_ctx != NULL; ++key_share_ctx)
        if ((*key_share_ctx)->algo->id == ch->esni.key_share->id)
            break;
    if (*key_share_ctx == NULL) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    /* calculate ESNIContents */
    if ((ret = build_esni_contents_hash(ch->esni.cipher->hash, (*secret)->esni_contents_hash, ch->esni.record_digest,
                                        ch->esni.key_share->id, ch->esni.peer_key, ch->random_bytes)) != 0)
        goto Exit;
    /* derive the shared secret */
    if ((ret = (*key_share_ctx)->on_exchange(key_share_ctx, 0, &(*secret)->secret, ch->esni.peer_key)) != 0)
        goto Exit;
    /* decrypt */
    if (ch->esni.encrypted_sni.len - ch->esni.cipher->aead->tag_size != (*esni)->padded_length + PTLS_ESNI_NONCE_SIZE) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    if ((decrypted = malloc((*esni)->padded_length + PTLS_ESNI_NONCE_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((ret = create_esni_aead(&aead, 0, ch->esni.cipher, (*secret)->secret, (*secret)->esni_contents_hash)) != 0)
        goto Exit;
    if (ptls_aead_decrypt(aead, decrypted, ch->esni.encrypted_sni.base, ch->esni.encrypted_sni.len, 0, ch->key_shares.base,
                          ch->key_shares.len) != (*esni)->padded_length + PTLS_ESNI_NONCE_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ptls_aead_free(aead);
    aead = NULL;

    { /* decode sni */
        const uint8_t *src = decrypted, *const end = src + (*esni)->padded_length;
        ptls_iovec_t found_name;
        if (end - src < PTLS_ESNI_NONCE_SIZE) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        memcpy((*secret)->nonce, src, PTLS_ESNI_NONCE_SIZE);
        src += PTLS_ESNI_NONCE_SIZE;
        if ((ret = client_hello_decode_server_name(&found_name, &src, end)) != 0)
            goto Exit;
        for (; src != end; ++src) {
            if (*src != '\0') {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        }
        /* if successful, reuse memory allocated for padded_server_name for storing the found name (freed by the caller) */
        memmove(decrypted, found_name.base, found_name.len);
        *server_name = ptls_iovec_init(decrypted, found_name.len);
        decrypted = NULL;
    }

    ret = 0;
Exit:
    if (decrypted != NULL)
        free(decrypted);
    if (aead != NULL)
        ptls_aead_free(aead);
    if (ret != 0 && *secret != NULL)
        free_esni_secret(secret, 1);
    return ret;
}